

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

int numbertocolor(int n)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int color;
  int green;
  int blue;
  int red;
  int n_local;
  
  blue = n;
  if (n < 0) {
    blue = 0;
  }
  iVar1 = rangecolor(blue / 100);
  iVar2 = rangecolor((int)((long)((ulong)(uint)((int)((long)blue / 10) >> 0x1f) << 0x20 |
                                 (long)blue / 10 & 0xffffffffU) % 10));
  uVar3 = rangecolor(blue % 10);
  return uVar3 | iVar2 << 8 | iVar1 << 0x10;
}

Assistant:

static int numbertocolor(int n)
{
    int red, blue, green, color = 0;
    if (n < 0) n = 0;
    red = n / 100;
    blue = ((n / 10) % 10);
    green = n % 10;
    color |= rangecolor(red)   << 16;
    color |= rangecolor(blue)  <<  8;
    color |= rangecolor(green) <<  0;
    return color;
}